

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_splice_aarch64(void *vd,void *vn,void *vm,void *vg,uint32_t desc)

{
  int32_t iVar1;
  int iVar2;
  intptr_t iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_188 [8];
  ARMVectorReg_conflict tmp;
  long local_80;
  intptr_t last_i;
  intptr_t first_i;
  intptr_t i;
  uint64_t mask;
  uint64_t len;
  uint64_t last_g;
  uint64_t first_g;
  uint64_t pg;
  int esz;
  intptr_t opr_sz;
  uint32_t desc_local;
  void *vg_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  iVar3 = simd_oprsz(desc);
  lVar4 = iVar3 / 8;
  iVar1 = simd_data(desc);
  local_80 = 0;
  last_i = 0;
  len = 0;
  last_g = 0;
  first_i = ((lVar4 + 7) / 8) * 8;
  while (first_i = first_i + -8, -1 < first_i) {
    uVar5 = *(ulong *)((long)vg + first_i) & pred_esz_masks_aarch64[iVar1];
    if (uVar5 != 0) {
      if (len == 0) {
        local_80 = first_i;
        len = uVar5;
      }
      last_i = first_i;
      last_g = uVar5;
    }
  }
  mask = 0;
  vg_local = vm;
  if (last_g != 0) {
    iVar2 = ctz64(last_g);
    lVar6 = last_i * 8 + (long)iVar2;
    iVar2 = clz64(len);
    mask = (((local_80 * 8 + 0x3f) - (long)iVar2) - lVar6) + (1L << ((byte)iVar1 & 0x3f));
    if (vd == vm) {
      memcpy(local_188,vm,lVar4 << 3);
      vg_local = local_188;
    }
    swap_memmove(vd,(void *)((long)vn + lVar6),mask);
  }
  swap_memmove((void *)((long)vd + mask),vg_local,lVar4 * 8 - mask);
  return;
}

Assistant:

void HELPER(sve_splice)(void *vd, void *vn, void *vm, void *vg, uint32_t desc)
{
    intptr_t opr_sz = simd_oprsz(desc) / 8;
    int esz = simd_data(desc);
    uint64_t pg, first_g, last_g, len, mask = pred_esz_masks[esz];
    intptr_t i, first_i, last_i;
    ARMVectorReg tmp;

    first_i = last_i = 0;
    first_g = last_g = 0;

    /* Find the extent of the active elements within VG.  */
    for (i = QEMU_ALIGN_UP(opr_sz, 8) - 8; i >= 0; i -= 8) {
        pg = *(uint64_t *)((char *)vg + i) & mask;
        if (pg) {
            if (last_g == 0) {
                last_g = pg;
                last_i = i;
            }
            first_g = pg;
            first_i = i;
        }
    }

    len = 0;
    if (first_g != 0) {
        first_i = first_i * 8 + ctz64(first_g);
        last_i = last_i * 8 + 63 - clz64(last_g);
        len = last_i - first_i + (1ULL << esz);
        if (vd == vm) {
            vm = memcpy(&tmp, vm, opr_sz * 8);
        }
        swap_memmove(vd, (char *)vn + first_i, len);
    }
    swap_memmove((char *)vd + len, vm, opr_sz * 8 - len);
}